

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O1

RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice,RK_S32 cur_list)

{
  RK_U8 RVar1;
  RK_S32 index;
  int *piVar2;
  h264_frame_store_t *phVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  RK_U32 RVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  RK_U32 RVar13;
  h264_store_pic_t *phVar14;
  int iVar15;
  ulong uVar16;
  MppFrame mframe;
  MppFrame local_48;
  h264d_video_ctx_t *local_40;
  RK_S32 *local_38;
  
  piVar2 = currSlice->modification_of_pic_nums_idc[(uint)cur_list];
  local_40 = currSlice->p_Vid;
  uVar9 = local_40->max_frame_num;
  if (currSlice->structure == 3) {
    iVar5 = currSlice->frame_num;
  }
  else {
    uVar9 = uVar9 * 2;
    iVar5 = currSlice->frame_num * 2 + 1;
  }
  iVar6 = *piVar2;
  RVar13 = 0;
  if (iVar6 != 3) {
    local_38 = currSlice->abs_diff_pic_num_minus1[(uint)cur_list];
    uVar16 = 0;
    RVar13 = 0;
    iVar15 = iVar5;
    do {
      if (iVar6 < 4) {
        uVar7 = 0;
        if (iVar6 < 2) {
          if (iVar6 == 0) {
            iVar15 = iVar15 + ~local_38[uVar16];
            iVar15 = iVar15 + (iVar15 >> 0x1f & uVar9);
          }
          else {
            iVar15 = iVar15 + local_38[uVar16] + 1;
            uVar7 = uVar9;
            if (iVar15 < (int)uVar9) {
              uVar7 = 0;
            }
            iVar15 = iVar15 - uVar7;
          }
          uVar7 = 0;
          if (iVar5 < iVar15) {
            uVar7 = uVar9;
          }
          uVar10 = currSlice->p_Dpb->ref_frames_in_buffer - 1;
          if ((int)uVar10 < 0) {
            phVar14 = (h264_store_pic_t *)0x0;
          }
          else {
            lVar11 = (ulong)uVar10 + 1;
            do {
              phVar3 = currSlice->p_Dpb->fs_ref[lVar11 + -1];
              uVar10 = phVar3->is_reference;
              if (currSlice->structure == 3) {
                if (uVar10 == 3) {
                  phVar14 = phVar3->frame;
                  RVar1 = phVar14->is_long_term;
joined_r0x0019b619:
                  if ((RVar1 == '\0') && (phVar14->pic_num == iVar15 - uVar7)) goto LAB_0019b64d;
                }
              }
              else {
                if ((((uVar10 & 1) != 0) &&
                    (phVar14 = phVar3->top_field, phVar14->is_long_term == '\0')) &&
                   (phVar14->pic_num == iVar15 - uVar7)) goto LAB_0019b64d;
                if ((uVar10 & 2) != 0) {
                  phVar14 = phVar3->bottom_field;
                  RVar1 = phVar14->is_long_term;
                  goto joined_r0x0019b619;
                }
              }
              lVar12 = lVar11 + -1;
              bVar4 = 0 < lVar11;
              lVar11 = lVar12;
            } while (lVar12 != 0 && bVar4);
            phVar14 = (h264_store_pic_t *)0x0;
          }
LAB_0019b64d:
          if (phVar14 == (h264_store_pic_t *)0x0) {
            uVar7 = 1;
          }
          else {
            local_48 = (MppFrame)0x0;
            if ((h264d_debug._1_1_ & 0x10) != 0) {
              _mpp_log_l(4,"h264d_init","find short reference, slot_idx=%d.\n",(char *)0x0,
                         (ulong)(uint)phVar14->mem_mark->slot_idx);
            }
            uVar7 = 1;
            if (((phVar14 != (h264_store_pic_t *)0x0) &&
                (phVar14->mem_mark != (h264_dpb_mark_t *)0x0)) &&
               ((index = phVar14->mem_mark->slot_idx, -1 < index &&
                (mpp_buf_slot_get_prop(local_40->p_Dec->frame_slots,index,SLOT_FRAME_PTR,&local_48),
                local_48 != (MppFrame)0x0)))) {
              RVar8 = mpp_frame_get_errinfo(local_48);
              uVar7 = (uint)(RVar8 != 0);
            }
          }
        }
        RVar13 = RVar13 | uVar7;
      }
      if (0x1f < uVar16) {
        return RVar13;
      }
      iVar6 = piVar2[uVar16 + 1];
      uVar16 = uVar16 + 1;
    } while (iVar6 != 3);
  }
  return RVar13;
}

Assistant:

static RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice, RK_S32 cur_list)
{
    RK_S32 i = 0;
    RK_U32 dpb_error_flag = 0;
    RK_S32 maxPicNum = 0, currPicNum = 0;
    RK_S32 picNumLXNoWrap = 0, picNumLXPred = 0, picNumLX = 0;

    RK_S32 *modification_of_pic_nums_idc = currSlice->modification_of_pic_nums_idc[cur_list];
    RK_S32 *abs_diff_pic_num_minus1 = currSlice->abs_diff_pic_num_minus1[cur_list];
    RK_S32 *long_term_pic_idx = currSlice->long_term_pic_idx[cur_list];
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;

    if (currSlice->structure == FRAME) {
        maxPicNum  = p_Vid->max_frame_num;
        currPicNum = currSlice->frame_num;
    } else {
        maxPicNum  = 2 * p_Vid->max_frame_num;
        currPicNum = 2 * currSlice->frame_num + 1;
    }
    picNumLXPred = currPicNum;
    for (i = 0; modification_of_pic_nums_idc[i] != 3 && i < MAX_REORDER_TIMES; i++) {
        H264_StorePic_t *tmp = NULL;
        RK_U32 error_flag = 0;
        if (modification_of_pic_nums_idc[i] > 3)
            continue;
        if (modification_of_pic_nums_idc[i] < 2) {
            if (modification_of_pic_nums_idc[i] == 0) {
                if ( (picNumLXPred - (abs_diff_pic_num_minus1[i] + 1)) < 0)
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1) + maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1);
            } else { //!< (modification_of_pic_nums_idc[i] == 1)
                if (picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) >= maxPicNum)
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) - maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1);
            }
            picNumLXPred = picNumLXNoWrap;
            picNumLX = (picNumLXNoWrap > currPicNum) ? (picNumLXNoWrap - maxPicNum) : picNumLXNoWrap;
            error_flag = 1;
            if (get_short_term_pic(currSlice, picNumLX, &tmp)) { //!< find short reference
                MppFrame mframe = NULL;
                H264D_DBG(H264D_DBG_DPB_REF_ERR, "find short reference, slot_idx=%d.\n", tmp->mem_mark->slot_idx);
                if (tmp && tmp->mem_mark && tmp->mem_mark->slot_idx >= 0) {
                    mpp_buf_slot_get_prop(p_Vid->p_Dec->frame_slots, tmp->mem_mark->slot_idx, SLOT_FRAME_PTR, &mframe);
                    if (mframe && !mpp_frame_get_errinfo(mframe)) {
                        error_flag = 0;
                    }
                }
            }

        } else { //!< (modification_of_pic_nums_idc[i] == 2)
            tmp = get_long_term_pic(currSlice, long_term_pic_idx[i]);
        }
        dpb_error_flag |= error_flag;
    }

    return dpb_error_flag;
}